

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_SecureChannel_sendBinaryMessage
          (UA_SecureChannel *channel,UA_UInt32 requestId,void *content,UA_DataType *contentType)

{
  UA_Connection *pUVar1;
  UA_StatusCode UVar2;
  uint uVar3;
  undefined8 uStack_98;
  UA_NodeId typeId;
  undefined1 local_70 [8];
  UA_ChunkInfo ci;
  undefined1 local_40 [8];
  UA_ByteString message;
  
  pUVar1 = channel->connection;
  if (pUVar1 == (UA_Connection *)0x0) {
    UVar2 = 0x80020000;
  }
  else {
    ci.errorCode = requestId;
    UVar2 = (*pUVar1->getSendBuffer)
                      (pUVar1,(size_t)(pUVar1->localConf).sendBufferSize,(UA_ByteString *)local_40);
    if (UVar2 == 0) {
      pos = (UA_Byte *)(message.length + 0x18);
      typeId.identifier.string.length = (size_t)(contentType->typeId).identifier.string.data;
      uStack_98._0_2_ = (contentType->typeId).namespaceIndex;
      uStack_98._2_2_ = *(undefined2 *)&(contentType->typeId).field_0x2;
      uStack_98._4_4_ = (contentType->typeId).identifierType;
      typeId._2_2_ = 0;
      typeId.namespaceIndex = contentType->binaryEncodingId;
      typeId.identifierType =
           (UA_NodeIdType)((contentType->typeId).identifier.string.length >> 0x20);
      end = (UA_Byte *)(message.length + (long)local_40);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_40;
      local_40 = (undefined1  [8])((long)local_40 - 0x18);
      message.length = (size_t)pos;
      UA_encodeBinaryInternal(&uStack_98,UA_TYPES + 0x10);
      ci.channel._0_4_ = ci.errorCode;
      ci.requestId._0_2_ = 0;
      ci.chunksSoFar = 0;
      ci._18_6_ = 0;
      ci.messageSizeSoFar._0_1_ = '\0';
      ci.channel._4_4_ = 0x47534d;
      ci.messageSizeSoFar._4_4_ = 0;
      uVar3 = typeId._0_4_ - 0x1be;
      if ((uVar3 < 10) && ((0x249U >> (uVar3 & 0x1f) & 1) != 0)) {
        ci.channel._4_4_ = *(undefined4 *)(&DAT_0012e8a0 + (ulong)uVar3 * 4);
      }
      end = (UA_Byte *)(message.length + (long)local_40);
      encodeBuf = (UA_ByteString *)local_40;
      exchangeBufferCallback = UA_SecureChannel_sendChunk;
      exchangeBufferCallbackHandle = local_70;
      local_70 = (undefined1  [8])channel;
      UVar2 = UA_encodeBinaryInternal(content,contentType);
      if (UVar2 == 0) {
        ci.messageSizeSoFar._0_1_ = 1;
        UVar2 = UA_SecureChannel_sendChunk
                          ((UA_ChunkInfo *)local_70,(UA_ByteString *)local_40,
                           (long)pos - message.length);
      }
      else if ((char)ci.messageSizeSoFar == '\0') {
        ci.messageSizeSoFar._4_4_ = UVar2;
        UA_SecureChannel_sendChunk
                  ((UA_ChunkInfo *)local_70,(UA_ByteString *)local_40,(long)pos - message.length);
      }
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_SecureChannel_sendBinaryMessage(UA_SecureChannel *channel, UA_UInt32 requestId,
                                   const void *content, const UA_DataType *contentType) {
    UA_Connection *connection = channel->connection;
    if(!connection)
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Allocate the message buffer */
    UA_ByteString message;
    UA_StatusCode retval =
        connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Hide the message beginning where the header will be encoded */
    message.data = &message.data[UA_SECURE_MESSAGE_HEADER_LENGTH];
    message.length -= UA_SECURE_MESSAGE_HEADER_LENGTH;

    /* Encode the message type */
    size_t messagePos = 0;
    UA_NodeId typeId = contentType->typeId; /* always numeric */
    typeId.identifier.numeric = contentType->binaryEncodingId;
    UA_NodeId_encodeBinary(&typeId, &message, &messagePos);

    /* Encode with the chunking callback */
    UA_ChunkInfo ci;
    ci.channel = channel;
    ci.requestId = requestId;
    ci.chunksSoFar = 0;
    ci.messageSizeSoFar = 0;
    ci.final = false;
    ci.messageType = UA_MESSAGETYPE_MSG;
    ci.errorCode = UA_STATUSCODE_GOOD;
    if(typeId.identifier.numeric == 446 || typeId.identifier.numeric == 449)
        ci.messageType = UA_MESSAGETYPE_OPN;
    else if(typeId.identifier.numeric == 452 || typeId.identifier.numeric == 455)
        ci.messageType = UA_MESSAGETYPE_CLO;
    retval = UA_encodeBinary(content, contentType,
                             (UA_exchangeEncodeBuffer)UA_SecureChannel_sendChunk,
                             &ci, &message, &messagePos);

    /* Encoding failed, release the message */
    if(retval != UA_STATUSCODE_GOOD) {
        if(!ci.final) {
            /* the abort message was not send */
            ci.errorCode = retval;
            UA_SecureChannel_sendChunk(&ci, &message, messagePos);
        }
        return retval;
    }

    /* Encoding finished, send the final chunk */
    ci.final = UA_TRUE;
    return UA_SecureChannel_sendChunk(&ci, &message, messagePos);
}